

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_frost_breath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  int in_R8D;
  int hpch;
  int dice_dam;
  int hp_dam;
  int dam;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  CHAR_DATA *victim;
  int in_stack_00000074;
  int in_stack_00000078;
  int in_stack_0000007c;
  void *in_stack_00000080;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffc4;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  CHAR_DATA *pCVar6;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *pCVar7;
  int in_stack_ffffffffffffffe0;
  CHAR_DATA *victim_00;
  int dam_type;
  
  victim_00 = in_RCX;
  act(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
      (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
      (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  act(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
      (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
      (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  act(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
      (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
      (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  iVar2 = in_RDX->hit / 9;
  iVar3 = dice(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  iVar4 = iVar2 + iVar3;
  if (in_RDX->hit < iVar4) {
    iVar4 = in_RDX->hit;
  }
  uVar5 = 0;
  cold_effect(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000074);
  pCVar6 = in_RCX->in_room->people;
  while (pCVar7 = pCVar6, pCVar7 != (CHAR_DATA *)0x0) {
    pCVar6 = pCVar7->next_in_room;
    bVar1 = is_safe((CHAR_DATA *)CONCAT44(iVar4,uVar5),(CHAR_DATA *)CONCAT44(iVar3,iVar2));
    if ((((!bVar1) || (pCVar7->fighting == (CHAR_DATA *)0x0)) || (pCVar7->fighting == in_RDX)) &&
       (pCVar7 != in_RDX)) {
      dam_type = (int)((ulong)in_RDX >> 0x20);
      if (pCVar7 == in_RCX) {
        bVar1 = saves_spell(hpch,(CHAR_DATA *)CONCAT44(in_EDI,in_ESI),dam_type);
        if (bVar1) {
          cold_effect(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000074);
          damage_old(in_RDX,victim_00,in_R8D,in_stack_ffffffffffffffe0,(int)((ulong)in_RCX >> 0x20),
                     SUB81((ulong)in_RCX >> 0x18,0));
        }
        else {
          cold_effect(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000074);
          damage_old(in_RDX,victim_00,in_R8D,in_stack_ffffffffffffffe0,(int)((ulong)in_RCX >> 0x20),
                     SUB81((ulong)in_RCX >> 0x18,0));
        }
      }
      else {
        bVar1 = saves_spell(hpch,(CHAR_DATA *)CONCAT44(in_EDI,in_ESI),dam_type);
        if (bVar1) {
          cold_effect(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000074);
          damage_old(in_RDX,victim_00,in_R8D,in_stack_ffffffffffffffe0,(int)((ulong)in_RCX >> 0x20),
                     SUB81((ulong)in_RCX >> 0x18,0));
        }
        else {
          cold_effect(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000074);
          damage_old(in_RDX,victim_00,in_R8D,in_stack_ffffffffffffffe0,(int)((ulong)in_RCX >> 0x20),
                     SUB81((ulong)in_RCX >> 0x18,0));
        }
      }
    }
  }
  return;
}

Assistant:

void spell_frost_breath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	CHAR_DATA *vch, *vch_next;
	int dam, hp_dam, dice_dam, hpch;

	act("$n breathes out a freezing cone of frost!", ch, nullptr, victim, TO_NOTVICT);
	act("$n breathes a freezing cone of frost over you!", ch, nullptr, victim, TO_VICT);
	act("You breath out a cone of frost.", ch, nullptr, nullptr, TO_CHAR);

	hpch = ch->hit / 9;
	dice_dam = dice(level, 5);
	dam = hpch + dice_dam;

	if (dam > ch->hit)
		dam = ch->hit;

	hp_dam = 0;

	/*
	hpch = std::max(12,ch->hit);
	hp_dam = number_range(hpch/11 + 1, hpch/6);
	dice_dam = dice(level,16);

	dam = std::max(hp_dam + dice_dam/10,dice_dam + hp_dam/10);
	*/

	cold_effect(victim->in_room, level, dam / 2, TARGET_ROOM);

	for (vch = victim->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;
		/*
		if (is_safe_spell(ch,vch,true)
			||  (is_npc(vch) && is_npc(ch) && (ch->fighting != vch || vch->fighting != ch)))
		{
			continue;
		}
		*/

		if ((is_safe(ch, vch) && vch->fighting != nullptr && vch->fighting != ch) || vch == ch)
			continue;

		if (vch == victim) /* full damage */
		{
			if (saves_spell(level, vch, DAM_COLD))
			{
				cold_effect(vch, level / 2, dam / 4, TARGET_CHAR);
				damage_old(ch, vch, dam / 2, sn, DAM_COLD, true);
			}
			else
			{
				cold_effect(vch, level, dam, TARGET_CHAR);
				damage_old(ch, vch, dam, sn, DAM_COLD, true);
			}
		}
		else
		{
			if (saves_spell(level - 2, vch, DAM_COLD))
			{
				cold_effect(vch, level / 4, dam / 8, TARGET_CHAR);
				damage_old(ch, vch, dam / 4, sn, DAM_COLD, true);
			}
			else
			{
				cold_effect(vch, level / 2, dam / 4, TARGET_CHAR);
				damage_old(ch, vch, dam / 2, sn, DAM_COLD, true);
			}
		}
	}
}